

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopher.c
# Opt level: O0

CURLcode gopher_do(connectdata *conn,_Bool *done)

{
  int iVar1;
  size_t sVar2;
  char *newp;
  size_t len;
  ssize_t k;
  ssize_t amount;
  char *sel_org;
  char *sel;
  char *query;
  char *path;
  char *gopherpath;
  Curl_easy *pCStack_30;
  curl_socket_t sockfd;
  Curl_easy *data;
  _Bool *p_Stack_20;
  CURLcode result;
  _Bool *done_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  pCStack_30 = conn->data;
  gopherpath._4_4_ = conn->sock[0];
  query = (pCStack_30->state).up.path;
  sel = (pCStack_30->state).up.query;
  sel_org = (char *)0x0;
  amount = 0;
  *done = true;
  p_Stack_20 = done;
  done_local = (_Bool *)conn;
  if (sel == (char *)0x0) {
    path = (*Curl_cstrdup)(query);
  }
  else {
    path = curl_maprintf("%s?%s",query,sel);
  }
  if (path == (char *)0x0) {
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar2 = strlen(path);
    if (sVar2 < 3) {
      sel_org = "";
      newp = (char *)strlen("");
      (*Curl_cfree)(path);
    }
    else {
      data._4_4_ = Curl_urldecode(pCStack_30,path + 2,0,&sel_org,(size_t *)&newp,false);
      (*Curl_cfree)(path);
      if (data._4_4_ != CURLE_OK) {
        return data._4_4_;
      }
      amount = (ssize_t)sel_org;
    }
    len = curlx_uztosz((size_t)newp);
    do {
      data._4_4_ = Curl_write((connectdata *)done_local,gopherpath._4_4_,sel_org,len,&k);
      if ((data._4_4_ != CURLE_OK) ||
         (data._4_4_ = Curl_client_write((connectdata *)done_local,2,sel_org,k),
         data._4_4_ != CURLE_OK)) goto LAB_00158c26;
      len = len - k;
      sel_org = sel_org + k;
      if ((long)len < 1) goto LAB_00158c26;
      iVar1 = Curl_socket_check(-1,-1,gopherpath._4_4_,100);
    } while (-1 < iVar1);
    data._4_4_ = CURLE_SEND_ERROR;
LAB_00158c26:
    (*Curl_cfree)((void *)amount);
    if (data._4_4_ == CURLE_OK) {
      data._4_4_ = Curl_sendf(gopherpath._4_4_,(connectdata *)done_local,"\r\n");
    }
    if (data._4_4_ == CURLE_OK) {
      data._4_4_ = Curl_client_write((connectdata *)done_local,2,"\r\n",2);
      conn_local._4_4_ = data._4_4_;
      if (data._4_4_ == CURLE_OK) {
        Curl_setup_transfer(pCStack_30,0,-1,false,-1);
        conn_local._4_4_ = CURLE_OK;
      }
    }
    else {
      Curl_failf(pCStack_30,"Failed sending Gopher request");
      conn_local._4_4_ = data._4_4_;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode gopher_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
  char *gopherpath;
  char *path = data->state.up.path;
  char *query = data->state.up.query;
  char *sel = NULL;
  char *sel_org = NULL;
  ssize_t amount, k;
  size_t len;

  *done = TRUE; /* unconditionally */

  /* path is guaranteed non-NULL */
  DEBUGASSERT(path);

  if(query)
    gopherpath = aprintf("%s?%s", path, query);
  else
    gopherpath = strdup(path);

  if(!gopherpath)
    return CURLE_OUT_OF_MEMORY;

  /* Create selector. Degenerate cases: / and /1 => convert to "" */
  if(strlen(gopherpath) <= 2) {
    sel = (char *)"";
    len = strlen(sel);
    free(gopherpath);
  }
  else {
    char *newp;

    /* Otherwise, drop / and the first character (i.e., item type) ... */
    newp = gopherpath;
    newp += 2;

    /* ... and finally unescape */
    result = Curl_urldecode(data, newp, 0, &sel, &len, FALSE);
    free(gopherpath);
    if(result)
      return result;
    sel_org = sel;
  }

  /* We use Curl_write instead of Curl_sendf to make sure the entire buffer is
     sent, which could be sizeable with long selectors. */
  k = curlx_uztosz(len);

  for(;;) {
    result = Curl_write(conn, sockfd, sel, k, &amount);
    if(!result) { /* Which may not have written it all! */
      result = Curl_client_write(conn, CLIENTWRITE_HEADER, sel, amount);
      if(result)
        break;

      k -= amount;
      sel += amount;
      if(k < 1)
        break; /* but it did write it all */
    }
    else
      break;

    /* Don't busyloop. The entire loop thing is a work-around as it causes a
       BLOCKING behavior which is a NO-NO. This function should rather be
       split up in a do and a doing piece where the pieces that aren't
       possible to send now will be sent in the doing function repeatedly
       until the entire request is sent.

       Wait a while for the socket to be writable. Note that this doesn't
       acknowledge the timeout.
    */
    if(SOCKET_WRITABLE(sockfd, 100) < 0) {
      result = CURLE_SEND_ERROR;
      break;
    }
  }

  free(sel_org);

  if(!result)
    /* We can use Curl_sendf to send the terminal \r\n relatively safely and
       save allocing another string/doing another _write loop. */
    result = Curl_sendf(sockfd, conn, "\r\n");
  if(result) {
    failf(data, "Failed sending Gopher request");
    return result;
  }
  result = Curl_client_write(conn, CLIENTWRITE_HEADER, (char *)"\r\n", 2);
  if(result)
    return result;

  Curl_setup_transfer(data, FIRSTSOCKET, -1, FALSE, -1);
  return CURLE_OK;
}